

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GoogleTestApprovalsTests.cpp
# Opt level: O3

void __thiscall
GoogleTestApprovalsTests_SpecificReporter_Test::TestBody
          (GoogleTestApprovalsTests_SpecificReporter_Test *this)

{
  Options local_e0;
  AraxisMergeReporter local_78;
  
  ApprovalTests::Windows::AraxisMergeReporter::AraxisMergeReporter(&local_78);
  ApprovalTests::Options::Options(&local_e0,(Reporter *)&local_78);
  ApprovalTests::TApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>>::
  verify<char[20],int>((char (*) [20])"text to be verified",&local_e0);
  if (local_e0.namer_.super___shared_ptr<ApprovalTests::ApprovalNamer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e0.namer_.
               super___shared_ptr<ApprovalTests::ApprovalNamer,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_e0.scrubber_.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_e0.scrubber_.super__Function_base._M_manager)
              ((_Any_data *)&local_e0.scrubber_,(_Any_data *)&local_e0.scrubber_,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.fileOptions_.fileExtensionWithDot_._M_dataplus._M_p !=
      &local_e0.fileOptions_.fileExtensionWithDot_.field_2) {
    operator_delete(local_e0.fileOptions_.fileExtensionWithDot_._M_dataplus._M_p);
  }
  local_78.super_GenericDiffReporter.super_CommandReporter.super_Reporter._vptr_Reporter =
       (_func_int **)&PTR__CommandReporter_00179c50;
  if (local_78.super_GenericDiffReporter.super_CommandReporter.converter.
      super___shared_ptr<ApprovalTests::ConvertForCygwin,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.super_GenericDiffReporter.super_CommandReporter.converter.
               super___shared_ptr<ApprovalTests::ConvertForCygwin,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.super_GenericDiffReporter.super_CommandReporter.arguments._M_dataplus._M_p !=
      &local_78.super_GenericDiffReporter.super_CommandReporter.arguments.field_2) {
    operator_delete(local_78.super_GenericDiffReporter.super_CommandReporter.arguments._M_dataplus.
                    _M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.super_GenericDiffReporter.super_CommandReporter.cmd._M_dataplus._M_p !=
      &local_78.super_GenericDiffReporter.super_CommandReporter.cmd.field_2) {
    operator_delete(local_78.super_GenericDiffReporter.super_CommandReporter.cmd._M_dataplus._M_p);
  }
  return;
}

Assistant:

TEST(GoogleTestApprovalsTests, SpecificReporter)
{
    // begin-snippet: basic_approval_with_reporter
    using namespace ApprovalTests;
    Approvals::verify("text to be verified", Options(Windows::AraxisMergeReporter()));
    // end-snippet
}